

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
          (DrawIndirectBase *this,GLboolean mapped,GLbitfield access,GLbitfield accessFlag,
          GLintptr offset,GLsizeiptr length)

{
  bool bVar1;
  DILogger *pDVar2;
  long lVar3;
  DILogger local_9d8;
  DILogger local_858;
  string local_6d8;
  string local_6b8;
  DILogger local_698;
  DILogger local_518;
  GLbitfield local_394;
  undefined1 local_390 [4];
  int v;
  string local_370;
  DILogger local_350;
  GLbitfield local_1bc;
  undefined1 local_1b8 [4];
  int v_1;
  DIResult result;
  GLsizeiptr length_local;
  GLintptr offset_local;
  GLbitfield local_18;
  GLbitfield accessFlag_local;
  GLbitfield access_local;
  GLboolean mapped_local;
  DrawIndirectBase *this_local;
  
  result.status_ = length;
  length_local = offset;
  offset_local._4_4_ = accessFlag;
  local_18 = access;
  accessFlag_local._3_1_ = mapped;
  _access_local = this;
  DIResult::DIResult((DIResult *)local_1b8);
  bVar1 = test_api::ES3::isES();
  if ((!bVar1) &&
     (glu::CallLogWrapper::glGetBufferParameteriv
                (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f3f,0x88bb,
                 (GLint *)&local_1bc), local_1bc != local_18)) {
    DIResult::error(&local_350,(DIResult *)local_1b8);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)&local_350,
                        (char (*) [68])
                        "glGetBufferParameteriv(GL_BUFFER_ACCESS) returned incorrect state: ");
    glcts::(anonymous_namespace)::DrawIndirectBase::AccessToString_abi_cxx11_
              (&local_370,(DrawIndirectBase *)this,local_1bc);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)pDVar2,&local_370);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)pDVar2,(char (*) [13])0x2a14159);
    glcts::(anonymous_namespace)::DrawIndirectBase::AccessToString_abi_cxx11_
              ((string *)local_390,(DrawIndirectBase *)this,local_18);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)pDVar2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390);
    std::__cxx11::string::~string((string *)local_390);
    std::__cxx11::string::~string((string *)&local_370);
    DILogger::~DILogger(&local_350);
  }
  glu::CallLogWrapper::glGetBufferParameteriv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f3f,0x911f,
             (GLint *)&local_394);
  if (local_394 != offset_local._4_4_) {
    DIResult::error(&local_518,(DIResult *)local_1b8);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)&local_518,
                        (char (*) [74])
                        "glGetBufferParameteriv(GL_BUFFER_ACCESS_FLAGS) returned incorrect state: ")
    ;
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)pDVar2,(int *)&local_394);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)pDVar2,(char (*) [13])0x2a14159);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)pDVar2,(uint *)((long)&offset_local + 4));
    DILogger::~DILogger(&local_518);
  }
  glu::CallLogWrapper::glGetBufferParameteriv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f3f,0x88bc,
             (GLint *)&local_394);
  if (local_394 != accessFlag_local._3_1_) {
    DIResult::error(&local_698,(DIResult *)local_1b8);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)&local_698,
                        (char (*) [68])
                        "glGetBufferParameteriv(GL_BUFFER_MAPPED) returned incorrect state: ");
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              (&local_6b8,(DrawIndirectBase *)this,(GLboolean)local_394);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)pDVar2,&local_6b8);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)pDVar2,(char (*) [13])0x2a14159);
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              (&local_6d8,(DrawIndirectBase *)this,(GLboolean)local_18);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)pDVar2,&local_6d8);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::__cxx11::string::~string((string *)&local_6b8);
    DILogger::~DILogger(&local_698);
  }
  glu::CallLogWrapper::glGetBufferParameteriv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f3f,0x9121,
             (GLint *)&local_394);
  if ((int)local_394 != length_local) {
    DIResult::error(&local_858,(DIResult *)local_1b8);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)&local_858,
                        (char (*) [73])
                        "glGetBufferParameteriv(GL_BUFFER_MAP_OFFSET) returned incorrect offset: ");
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)pDVar2,(int *)&local_394);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)pDVar2,(char (*) [13])0x2a14159);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)pDVar2,&length_local);
    DILogger::~DILogger(&local_858);
  }
  glu::CallLogWrapper::glGetBufferParameteriv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f3f,0x9120,
             (GLint *)&local_394);
  if ((int)local_394 != result.status_) {
    DIResult::error(&local_9d8,(DIResult *)local_1b8);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)&local_9d8,
                        (char (*) [73])
                        "glGetBufferParameteriv(GL_BUFFER_MAP_LENGTH) returned incorrect length: ");
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)pDVar2,(int *)&local_394);
    pDVar2 = glcts::(anonymous_namespace)::DILogger::operator<<
                       ((DILogger *)pDVar2,(char (*) [13])0x2a14159);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)pDVar2,&result.status_);
    DILogger::~DILogger(&local_9d8);
  }
  lVar3 = DIResult::code((DIResult *)local_1b8);
  DIResult::~DIResult((DIResult *)local_1b8);
  return lVar3;
}

Assistant:

long StateValidate(GLboolean mapped, GLbitfield access, GLbitfield accessFlag, GLintptr offset, GLsizeiptr length)
	{
		DIResult result;

		if (!api::isES())
		{
			int v;
			glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_ACCESS, &v);
			if (v != static_cast<int>(access))
			{
				result.error() << "glGetBufferParameteriv(GL_BUFFER_ACCESS) returned incorrect state: "
							   << AccessToString(v) << ", expected: " << AccessToString(access);
			}
		}

		int v;
		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_ACCESS_FLAGS, &v);
		if (v != static_cast<int>(accessFlag))
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_ACCESS_FLAGS) returned incorrect state: " << v
						   << ", expected: " << accessFlag;
		}

		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAPPED, &v);
		if (v != mapped)
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_MAPPED) returned incorrect state: "
						   << BoolToString((GLboolean)v) << ", expected: " << BoolToString((GLboolean)access);
		}

		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_OFFSET, &v);
		if (v != offset)
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_MAP_OFFSET) returned incorrect offset: " << v
						   << ", expected: " << offset;
		}

		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_LENGTH, &v);
		if (v != length)
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_MAP_LENGTH) returned incorrect length: " << v
						   << ", expected: " << length;
		}

		return result.code();
	}